

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_init(nk_draw_list *list)

{
  float fVar1;
  float fVar2;
  float local_20;
  ulong uStack_18;
  float a;
  nk_size i;
  nk_draw_list *list_local;
  
  if (list != (nk_draw_list *)0x0) {
    if (list != (nk_draw_list *)0x0) {
      nk_zero(list,0xf0);
      for (uStack_18 = 0; uStack_18 < 0xc; uStack_18 = uStack_18 + 1) {
        local_20 = (float)uStack_18;
        fVar1 = (local_20 / 12.0) * 2.0 * 3.1415927;
        fVar2 = nk_cos(fVar1);
        list->circle_vtx[uStack_18].x = fVar2;
        fVar1 = nk_sin(fVar1);
        list->circle_vtx[uStack_18].y = fVar1;
      }
    }
    return;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x23b1,"void nk_draw_list_init(struct nk_draw_list *)");
}

Assistant:

NK_API void
nk_draw_list_init(struct nk_draw_list *list)
{
    nk_size i = 0;
    NK_ASSERT(list);
    if (!list) return;
    nk_zero(list, sizeof(*list));
    for (i = 0; i < NK_LEN(list->circle_vtx); ++i) {
        const float a = ((float)i / (float)NK_LEN(list->circle_vtx)) * 2 * NK_PI;
        list->circle_vtx[i].x = (float)NK_COS(a);
        list->circle_vtx[i].y = (float)NK_SIN(a);
    }
}